

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O1

filepos_t __thiscall
libmatroska::KaxBlockVirtual::UpdateSize(KaxBlockVirtual *this,bool param_1,bool param_2)

{
  byte *pbVar1;
  ushort uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  ushort *puVar4;
  
  uVar2 = this->TrackNumber;
  if (0x3fff < uVar2) {
    __assert_fail("TrackNumber < 0x4000",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                  ,0xf5,"virtual filepos_t libmatroska::KaxBlockVirtual::UpdateSize(bool, bool)");
  }
  pbVar1 = (this->super_EbmlBinary).Data;
  iVar3 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])
                    (this,CONCAT71(in_register_00000031,param_1),
                     CONCAT71(in_register_00000011,param_2));
  if (uVar2 < 0x80) {
    if (CONCAT44(extraout_var,iVar3) < 4) {
      __assert_fail("GetSize() >= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                    ,0xf9,"virtual filepos_t libmatroska::KaxBlockVirtual::UpdateSize(bool, bool)");
    }
    *pbVar1 = (byte)this->TrackNumber | 0x80;
    puVar4 = (ushort *)(pbVar1 + 1);
  }
  else {
    if (CONCAT44(extraout_var,iVar3) < 5) {
      __assert_fail("GetSize() >= 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                    ,0xfc,"virtual filepos_t libmatroska::KaxBlockVirtual::UpdateSize(bool, bool)");
    }
    *pbVar1 = *(byte *)((long)&this->TrackNumber + 1) | 0x40;
    pbVar1[1] = (byte)this->TrackNumber;
    puVar4 = (ushort *)(pbVar1 + 2);
  }
  if (this->ParentCluster != (KaxCluster *)0x0) {
    uVar2 = KaxCluster::GetBlockLocalTimecode(this->ParentCluster,this->Timecode);
    *puVar4 = uVar2 << 8 | uVar2 >> 8;
    *(byte *)(puVar4 + 1) = 0;
    iVar3 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    return CONCAT44(extraout_var_00,iVar3);
  }
  __assert_fail("ParentCluster != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                ,0x101,"virtual filepos_t libmatroska::KaxBlockVirtual::UpdateSize(bool, bool)");
}

Assistant:

filepos_t KaxBlockVirtual::UpdateSize(bool /* bSaveDefault */, bool /* bForceRender */)
{
  assert(TrackNumber < 0x4000);
  binary *cursor = EbmlBinary::GetBuffer();
  // fill data
  if (TrackNumber < 0x80) {
    assert(GetSize() >= 4);
    *cursor++ = TrackNumber | 0x80; // set the first bit to 1
  } else {
    assert(GetSize() >= 5);
    *cursor++ = (TrackNumber >> 8) | 0x40; // set the second bit to 1
    *cursor++ = TrackNumber & 0xFF;
  }

  assert(ParentCluster != NULL);
  int16 ActualTimecode = ParentCluster->GetBlockLocalTimecode(Timecode);
  big_int16 b16(ActualTimecode);
  b16.Fill(cursor);
  cursor += 2;

  *cursor++ = 0; // flags

  return GetSize();
}